

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlUnsetProp(xmlNodePtr node,xmlChar *name)

{
  xmlNodePtr cur;
  int iVar1;
  
  iVar1 = 0;
  cur = (xmlNodePtr)xmlGetPropNodeInternal(node,name,(xmlChar *)0x0,0);
  if (cur == (xmlNodePtr)0x0) {
    iVar1 = -1;
  }
  else {
    xmlUnlinkNode(cur);
    xmlFreeProp((xmlAttrPtr)cur);
  }
  return iVar1;
}

Assistant:

int
xmlUnsetProp(xmlNodePtr node, const xmlChar *name) {
    xmlAttrPtr prop;

    prop = xmlGetPropNodeInternal(node, name, NULL, 0);
    if (prop == NULL)
	return(-1);
    xmlUnlinkNode((xmlNodePtr) prop);
    xmlFreeProp(prop);
    return(0);
}